

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_expr.cpp
# Opt level: O0

FStringProd * DoubleToString(FProduction *prod)

{
  FStringProd *pFVar1;
  FStringProd *newprod;
  char buf [128];
  FProduction *prod_local;
  
  mysnprintf((char *)&newprod,0x80,"%g",*(undefined8 *)(prod + 2));
  pFVar1 = NewStringProd((char *)&newprod);
  M_Free(prod);
  return pFVar1;
}

Assistant:

static FStringProd *DoubleToString (FProduction *prod)
{
	char buf[128];
	FStringProd *newprod;

	mysnprintf (buf, countof(buf), "%g", static_cast<FDoubleProd *>(prod)->Value);
	newprod = NewStringProd (buf);
	M_Free (prod);
	return newprod;
}